

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svector.cc
# Opt level: O1

SVector * fizplex::operator*(SVector *__return_storage_ptr__,double c,SVector *vec)

{
  pointer pNVar1;
  Nonzero *n;
  pointer pNVar2;
  SVector *__range1;
  
  std::vector<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>::vector
            (&__return_storage_ptr__->values,&vec->values);
  pNVar1 = (__return_storage_ptr__->values).
           super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pNVar2 = (__return_storage_ptr__->values).
                super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>
                ._M_impl.super__Vector_impl_data._M_start; pNVar2 != pNVar1; pNVar2 = pNVar2 + 1) {
    pNVar2->value = pNVar2->value * c;
  }
  return __return_storage_ptr__;
}

Assistant:

SVector operator*(const double c, const SVector &vec) {
  SVector result = vec;
  for (auto &n : result)
    n.value *= c;
  return result;
}